

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,blend_unit_fn blend)

{
  uint uVar1;
  undefined4 uVar2;
  long lVar3;
  uint16_t *puVar5;
  undefined4 in_register_0000008c;
  longlong lVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i alVar9;
  long lVar4;
  
  lVar6 = CONCAT44(in_register_0000008c,src1_stride);
  lVar4 = (ulong)src1_stride * 2;
  lVar3 = (ulong)src0_stride * 2;
  puVar5 = src1;
  do {
    uVar1 = *(uint *)mask;
    uVar2 = *(undefined4 *)((long)mask + (ulong)mask_stride);
    auVar7[0] = pavgb((char)uVar2,(char)uVar1);
    auVar7[1] = pavgb((char)((uint)uVar2 >> 8),(char)(uVar1 >> 8));
    auVar7[2] = pavgb((char)((uint)uVar2 >> 0x10),(char)(uVar1 >> 0x10));
    auVar7[3] = pavgb((char)((uint)uVar2 >> 0x18),(char)(uVar1 >> 0x18));
    auVar7[4] = pavgb(0,0);
    auVar7[5] = pavgb(0,0);
    auVar7[6] = pavgb(0,0);
    auVar7[7] = pavgb(0,0);
    auVar7[8] = pavgb(0,0);
    auVar7[9] = pavgb(0,0);
    auVar7[10] = pavgb(0,0);
    auVar7[0xb] = pavgb(0,0);
    auVar7[0xc] = pavgb(0,0);
    auVar7[0xd] = pavgb(0,0);
    auVar7[0xe] = pavgb(0,0);
    auVar7[0xf] = pavgb(0,0);
    pmovzxbw(ZEXT416(uVar1),auVar7);
    pmovsxbw(auVar7,0x4040404040404040);
    alVar8[1] = lVar3;
    alVar8[0] = lVar4;
    alVar9[1] = lVar6;
    alVar9[0] = (longlong)puVar5;
    alVar8 = (*blend)(src0,src1,alVar8,alVar9);
    lVar4 = alVar8[1];
    *(undefined8 *)dst = extraout_XMM0_Qa;
    mask = (uint8_t *)((long)mask + (ulong)(mask_stride * 2));
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    const __m128i v_ra_b = xx_loadl_32(mask);
    const __m128i v_rb_b = xx_loadl_32(mask + mask_stride);
    const __m128i v_a_b = _mm_avg_epu8(v_ra_b, v_rb_b);

    const __m128i v_m0_w = _mm_cvtepu8_epi16(v_a_b);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend(src0, src1, v_m0_w, v_m1_w);

    xx_storel_64(dst, v_res_w);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}